

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_wavelength_set.unit.cpp
# Opt level: O3

void __thiscall
TestCreateWavelengthSet_TestCreateWavelengthSet_File_Test::
~TestCreateWavelengthSet_TestCreateWavelengthSet_File_Test
          (TestCreateWavelengthSet_TestCreateWavelengthSet_File_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(TestCreateWavelengthSet, TestCreateWavelengthSet_File) {
	SCOPED_TRACE( "Begin Test: Create Wavelength Set From File." );

	//Not sure what the best way to test loading a file from
	//gtest using cmake is because the working directory seems to
	//depend on where the user chooses to put the cmake binaries
	//and that is outside of the control of the files.
	//
	//So in the meantime just load an example into a stringstream
	//and test the function to load from that
	std::istringstream sample_wavelength_set_file_contents = sample_wavelength_set_file();
	Wavelength_Set wl_set = load_wavelength_set(sample_wavelength_set_file_contents);

	EXPECT_EQ(wl_set.type, Wavelength_Set_Type::FILE);

	std::string expected_description = "5 nm intervals between 380 and 780 nm for color averages";
	EXPECT_EQ(wl_set.description, expected_description);
	size_t expected_size = 81;
	EXPECT_EQ(wl_set.values.size(), expected_size);	
	EXPECT_EQ(wl_set.values[0], .380);	
	EXPECT_EQ(wl_set.values[80], .780);
}